

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O2

void put1bitbwtile(TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
                  int32_t fromskew,int32_t toskew,uchar *pp)

{
  byte bVar1;
  uint32_t uVar2;
  uint32_t **ppuVar3;
  uint uVar4;
  uint32_t *puVar5;
  bool bVar6;
  
  ppuVar3 = img->BWmap;
  do {
    bVar6 = h == 0;
    h = h - 1;
    uVar4 = w;
    if (bVar6) {
      return;
    }
    for (; 7 < uVar4; uVar4 = uVar4 - 8) {
      bVar1 = *pp;
      pp = pp + 1;
      puVar5 = ppuVar3[bVar1];
      *cp = *puVar5;
      cp[1] = puVar5[1];
      cp[2] = puVar5[2];
      cp[3] = puVar5[3];
      cp[4] = puVar5[4];
      cp[5] = puVar5[5];
      cp[6] = puVar5[6];
      cp[7] = puVar5[7];
      cp = cp + 8;
    }
    if (uVar4 != 0) {
      puVar5 = ppuVar3[*pp];
      switch(uVar4) {
      case 7:
        uVar2 = *puVar5;
        puVar5 = puVar5 + 1;
        *cp = uVar2;
        cp = cp + 1;
      case 6:
        uVar2 = *puVar5;
        puVar5 = puVar5 + 1;
        *cp = uVar2;
        cp = cp + 1;
      case 5:
        uVar2 = *puVar5;
        puVar5 = puVar5 + 1;
        *cp = uVar2;
        cp = cp + 1;
      case 4:
        uVar2 = *puVar5;
        puVar5 = puVar5 + 1;
        *cp = uVar2;
        cp = cp + 1;
      case 3:
        uVar2 = *puVar5;
        puVar5 = puVar5 + 1;
        *cp = uVar2;
        cp = cp + 1;
      case 2:
        uVar2 = *puVar5;
        puVar5 = puVar5 + 1;
        *cp = uVar2;
        cp = cp + 1;
      case 1:
        pp = pp + 1;
        *cp = *puVar5;
        cp = cp + 1;
      }
    }
    pp = pp + fromskew / 8;
    cp = cp + toskew;
  } while( true );
}

Assistant:

DECLAREContigPutFunc(put1bitbwtile)
{
    uint32_t **BWmap = img->BWmap;

    (void)x;
    (void)y;
    fromskew /= 8;
    for (; h > 0; --h)
    {
        uint32_t *bw;
        UNROLL8(w, bw = BWmap[*pp++], *cp++ = *bw++);
        cp += toskew;
        pp += fromskew;
    }
}